

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O2

int quicly_loss_detect_loss
              (quicly_loss_t *loss,int64_t now,uint32_t max_ack_delay,int is_1rtt_only,
              quicly_loss_on_detect_cb on_loss_detected)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  quicly_sent_packet_t *pqVar6;
  long lVar7;
  quicly_sentmap_iter_t iter;
  
  uVar1 = (loss->rtt).smoothed;
  uVar2 = (loss->rtt).latest;
  loss->loss_time = 0x7fffffffffffffff;
  iVar4 = quicly_loss_init_sentmap_iter(loss,&iter,now,max_ack_delay,0);
  if (iVar4 == 0) {
    if (uVar1 < uVar2) {
      uVar1 = uVar2;
    }
    uVar5 = (ulong)(uVar1 * 9 + 7 >> 3);
LAB_00122772:
    do {
      pqVar6 = quicly_sentmap_get(&iter);
      uVar3 = pqVar6->packet_number;
      if (uVar3 == 0xffffffffffffffff) {
        if (is_1rtt_only == 0) {
          iVar4 = quicly_loss_init_sentmap_iter(loss,&iter,now,max_ack_delay,0);
          if (iVar4 == 0) goto LAB_00122809;
          return iVar4;
        }
LAB_00122813:
        while( true ) {
          if (pqVar6->sent_at == 0x7fffffffffffffff) {
            return 0;
          }
          if (loss->largest_acked_packet_plus1[pqVar6->ack_epoch] <= pqVar6->packet_number + 1)
          break;
          if (pqVar6->cc_bytes_in_flight != 0) {
            lVar7 = pqVar6->sent_at + uVar5;
            if (now < lVar7) {
              loss->loss_time = lVar7;
              return 0;
            }
            __assert_fail("now < sent->sent_at + delay_until_lost",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/loss.c"
                          ,0x5e,
                          "int quicly_loss_detect_loss(quicly_loss_t *, int64_t, uint32_t, int, quicly_loss_on_detect_cb)"
                         );
          }
          quicly_sentmap_skip(&iter);
LAB_00122809:
          pqVar6 = quicly_sentmap_get(&iter);
        }
        return 0;
      }
      if (((long)(loss->largest_acked_packet_plus1[pqVar6->ack_epoch] - 1) <= (long)uVar3) ||
         ((lVar7 = loss->largest_acked_packet_plus1[pqVar6->ack_epoch] - 4, lVar7 < (long)uVar3 &&
          ((long)(now - uVar5) < pqVar6->sent_at)))) {
        if (is_1rtt_only != 0) goto LAB_00122813;
LAB_001227a9:
        quicly_sentmap_skip(&iter);
        goto LAB_00122772;
      }
      if (pqVar6->cc_bytes_in_flight == 0) goto LAB_001227a9;
      (*on_loss_detected)(loss,pqVar6,SUB14(lVar7 < (long)uVar3,0));
      iVar4 = quicly_sentmap_update(&loss->sentmap,&iter,QUICLY_SENTMAP_EVENT_LOST);
    } while (iVar4 == 0);
  }
  return iVar4;
}

Assistant:

int quicly_loss_detect_loss(quicly_loss_t *loss, int64_t now, uint32_t max_ack_delay, int is_1rtt_only,
                            quicly_loss_on_detect_cb on_loss_detected)
{
    /* This function ensures that the value returned in loss_time is when the next application timer should be set for loss
     * detection. if no timer is required, loss_time is set to INT64_MAX. */

    const uint32_t delay_until_lost = ((loss->rtt.latest > loss->rtt.smoothed ? loss->rtt.latest : loss->rtt.smoothed) * 9 + 7) / 8;
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;
    int ret;

    loss->loss_time = INT64_MAX;

    if ((ret = quicly_loss_init_sentmap_iter(loss, &iter, now, max_ack_delay, 0)) != 0)
        return ret;

    /* Mark packets as lost if they are smaller than the largest_acked and outside either time-threshold or packet-threshold
     * windows. Once marked as lost, cc_bytes_in_flight becomes zero. */
    while ((sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX) {
        int64_t largest_acked_signed = loss->largest_acked_packet_plus1[sent->ack_epoch] - 1;
        if ((int64_t)sent->packet_number < largest_acked_signed &&
            (sent->sent_at <= now - delay_until_lost ||                                                      /* time threshold */
             (int64_t)sent->packet_number <= largest_acked_signed - QUICLY_LOSS_DEFAULT_PACKET_THRESHOLD)) { /* packet threshold */
            if (sent->cc_bytes_in_flight != 0) {
                on_loss_detected(loss, sent,
                                 (int64_t)sent->packet_number > largest_acked_signed - QUICLY_LOSS_DEFAULT_PACKET_THRESHOLD);
                if ((ret = quicly_sentmap_update(&loss->sentmap, &iter, QUICLY_SENTMAP_EVENT_LOST)) != 0)
                    return ret;
            } else {
                quicly_sentmap_skip(&iter);
            }
        } else {
            /* When only one PN space is active, it is possible to stop looking for packets that have to be considered lost and
             * continue on to calculating the loss time. Otherwise, iterate through the entire sentmap. */
            if (is_1rtt_only)
                break;
            quicly_sentmap_skip(&iter);
        }
    }

    if (!is_1rtt_only) {
        if ((ret = quicly_loss_init_sentmap_iter(loss, &iter, now, max_ack_delay, 0)) != 0)
            return ret;
        sent = quicly_sentmap_get(&iter);
    }

    /* schedule time-threshold alarm if there is a packet outstanding that is smaller than largest_acked */
    while (sent->sent_at != INT64_MAX && sent->packet_number + 1 < loss->largest_acked_packet_plus1[sent->ack_epoch]) {
        if (sent->cc_bytes_in_flight != 0) {
            assert(now < sent->sent_at + delay_until_lost);
            loss->loss_time = sent->sent_at + delay_until_lost;
            break;
        }
        quicly_sentmap_skip(&iter);
        sent = quicly_sentmap_get(&iter);
    }

    return 0;
}